

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

int32_t __thiscall icu_63::RuleBasedCollator::hashCode(RuleBasedCollator *this)

{
  uint uVar1;
  UBool UVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  LocalPointer<icu_63::UnicodeSet> set;
  UErrorCode errorCode;
  UnicodeSetIterator iter;
  LocalPointer<icu_63::UnicodeSet> local_70;
  int local_64;
  UnicodeSetIterator local_60;
  
  uVar3 = CollationSettings::hashCode(this->settings);
  if (this->data->base != (CollationData *)0x0) {
    local_64 = 0;
    local_70.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._0_4_ =
         (*(this->super_Collator).super_UObject._vptr_UObject[0x1f])(this,&local_64);
    local_70.super_LocalPointerBase<icu_63::UnicodeSet>.ptr._4_4_ = extraout_var;
    uVar1 = 0;
    if (local_64 < 1) {
      UnicodeSetIterator::UnicodeSetIterator
                (&local_60,(UnicodeSet *)local_70.super_LocalPointerBase<icu_63::UnicodeSet>.ptr);
      while( true ) {
        UVar2 = UnicodeSetIterator::next(&local_60);
        if ((UVar2 == '\0') || (local_60.codepoint == -1)) break;
        uVar4 = CollationData::getCE32(this->data,local_60.codepoint);
        uVar3 = uVar3 ^ uVar4;
      }
      UnicodeSetIterator::~UnicodeSetIterator(&local_60);
      uVar1 = uVar3;
    }
    uVar3 = uVar1;
    LocalPointer<icu_63::UnicodeSet>::~LocalPointer(&local_70);
  }
  return uVar3;
}

Assistant:

int32_t
RuleBasedCollator::hashCode() const {
    int32_t h = settings->hashCode();
    if(data->base == NULL) { return h; }  // root collator
    // Do not rely on the rule string, see comments in operator==().
    UErrorCode errorCode = U_ZERO_ERROR;
    LocalPointer<UnicodeSet> set(getTailoredSet(errorCode));
    if(U_FAILURE(errorCode)) { return 0; }
    UnicodeSetIterator iter(*set);
    while(iter.next() && !iter.isString()) {
        h ^= data->getCE32(iter.getCodepoint());
    }
    return h;
}